

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void renameTriggerFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  uint uVar1;
  uchar *puVar2;
  char *z;
  uchar *puVar3;
  uchar *z_00;
  ulong uVar4;
  int iVar5;
  int token;
  int local_4c;
  sqlite3_context *local_48;
  sqlite3 *local_40;
  void *local_38;
  
  local_48 = context;
  puVar2 = (uchar *)sqlite3ValueText(*argv,'\x01');
  local_38 = sqlite3ValueText(argv[1],'\x01');
  if ((puVar2 != (uchar *)0x0) && (*puVar2 != '\0')) {
    local_40 = (local_48->s).db;
    iVar5 = 3;
    uVar1 = 0;
    puVar3 = puVar2;
    do {
      uVar4 = (ulong)uVar1;
      z_00 = puVar3;
      do {
        z_00 = z_00 + (int)uVar1;
        uVar1 = sqlite3GetToken(z_00,&local_4c);
      } while (local_4c == 0x95);
      iVar5 = iVar5 + 1;
      if (local_4c == 0x68) {
        iVar5 = 0;
      }
      if (local_4c == 0x76) {
        iVar5 = 0;
      }
      if ((iVar5 == 2) && (((local_4c == 5 || (local_4c == 0x87)) || (local_4c == 0x2d)))) {
        z = sqlite3MPrintf(local_40,"%.*s\"%w\"%s",(long)puVar3 - (long)puVar2,puVar2,local_38,
                           puVar3 + uVar4);
        setResultStrOrError(local_48,z,-1,'\x01',sqlite3MallocSize);
        return;
      }
      puVar3 = z_00;
    } while (*z_00 != '\0');
  }
  return;
}

Assistant:

static void renameTriggerFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  unsigned char const *zSql = sqlite3_value_text(argv[0]);
  unsigned char const *zTableName = sqlite3_value_text(argv[1]);

  int token;
  Token tname;
  int dist = 3;
  unsigned char const *zCsr = zSql;
  int len = 0;
  char *zRet;
  sqlite3 *db = sqlite3_context_db_handle(context);

  UNUSED_PARAMETER(NotUsed);

  /* The principle used to locate the table name in the CREATE TRIGGER 
  ** statement is that the table name is the first token that is immediatedly
  ** preceded by either TK_ON or TK_DOT and immediatedly followed by one
  ** of TK_WHEN, TK_BEGIN or TK_FOR.
  */
  if( zSql ){
    do {

      if( !*zCsr ){
        /* Ran out of input before finding the table name. Return NULL. */
        return;
      }

      /* Store the token that zCsr points to in tname. */
      tname.z = (char*)zCsr;
      tname.n = len;

      /* Advance zCsr to the next token. Store that token type in 'token',
      ** and its length in 'len' (to be used next iteration of this loop).
      */
      do {
        zCsr += len;
        len = sqlite3GetToken(zCsr, &token);
      }while( token==TK_SPACE );
      assert( len>0 );

      /* Variable 'dist' stores the number of tokens read since the most
      ** recent TK_DOT or TK_ON. This means that when a WHEN, FOR or BEGIN 
      ** token is read and 'dist' equals 2, the condition stated above
      ** to be met.
      **
      ** Note that ON cannot be a database, table or column name, so
      ** there is no need to worry about syntax like 
      ** "CREATE TRIGGER ... ON ON.ON BEGIN ..." etc.
      */
      dist++;
      if( token==TK_DOT || token==TK_ON ){
        dist = 0;
      }
    } while( dist!=2 || (token!=TK_WHEN && token!=TK_FOR && token!=TK_BEGIN) );

    /* Variable tname now contains the token that is the old table-name
    ** in the CREATE TRIGGER statement.
    */
    zRet = sqlite3MPrintf(db, "%.*s\"%w\"%s", ((u8*)tname.z) - zSql, zSql, 
       zTableName, tname.z+tname.n);
    sqlite3_result_text(context, zRet, -1, SQLITE_DYNAMIC);
  }
}